

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

HttpAuthDetails * http_auth_details_new(void)

{
  HttpAuthDetails *pHVar1;
  strbuf *psVar2;
  
  pHVar1 = (HttpAuthDetails *)safemalloc(1,0x38,0);
  pHVar1->auth_type = AUTH_ERROR;
  pHVar1->digest_nonce_was_stale = false;
  *(undefined3 *)&pHVar1->field_0x5 = 0;
  *(undefined8 *)&pHVar1->digest_hash = 0;
  pHVar1->realm = (strbuf *)0x0;
  pHVar1->nonce = (strbuf *)0x0;
  pHVar1->opaque = (strbuf *)0x0;
  pHVar1->error = (strbuf *)0x0;
  pHVar1->got_opaque = false;
  pHVar1->hash_username = false;
  *(undefined6 *)&pHVar1->field_0x32 = 0;
  psVar2 = strbuf_new();
  pHVar1->realm = psVar2;
  psVar2 = strbuf_new();
  pHVar1->nonce = psVar2;
  psVar2 = strbuf_new();
  pHVar1->opaque = psVar2;
  psVar2 = strbuf_new();
  pHVar1->error = psVar2;
  return pHVar1;
}

Assistant:

static HttpAuthDetails *http_auth_details_new(void)
{
    HttpAuthDetails *d = snew(HttpAuthDetails);
    memset(d, 0, sizeof(*d));
    d->realm = strbuf_new();
    d->nonce = strbuf_new();
    d->opaque = strbuf_new();
    d->error = strbuf_new();
    return d;
}